

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

bool __thiscall ON_PostEffects::operator==(ON_PostEffects *this,ON_PostEffects *other)

{
  ON_PostEffect *pOVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ON_PostEffect **ppOVar5;
  ON_PostEffect *pep2;
  ON_PostEffect *pep1;
  int i;
  ON_SimpleArray<const_ON_PostEffect_*> a2;
  undefined1 local_38 [8];
  ON_SimpleArray<const_ON_PostEffect_*> a1;
  ON_PostEffects *other_local;
  ON_PostEffects *this_local;
  
  if ((other->_impl->_is_populated & 1U) == 0) {
    this_local._7_1_ = (bool)((this->_impl->_is_populated ^ 0xffU) & 1);
  }
  else if ((this->_impl->_is_populated & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    a1._16_8_ = other;
    ON_SimpleArray<const_ON_PostEffect_*>::ON_SimpleArray
              ((ON_SimpleArray<const_ON_PostEffect_*> *)local_38);
    (*this->_vptr_ON_PostEffects[10])(this,(ON_SimpleArray<const_ON_PostEffect_*> *)local_38);
    ON_SimpleArray<const_ON_PostEffect_*>::ON_SimpleArray
              ((ON_SimpleArray<const_ON_PostEffect_*> *)&i);
    (**(code **)(*(long *)a1._16_8_ + 0x50))(a1._16_8_,(ON_SimpleArray<const_ON_PostEffect_*> *)&i);
    iVar2 = ON_SimpleArray<const_ON_PostEffect_*>::Count
                      ((ON_SimpleArray<const_ON_PostEffect_*> *)local_38);
    iVar3 = ON_SimpleArray<const_ON_PostEffect_*>::Count
                      ((ON_SimpleArray<const_ON_PostEffect_*> *)&i);
    if (iVar2 == iVar3) {
      pep1._0_4_ = 0;
      while( true ) {
        iVar2 = ON_SimpleArray<const_ON_PostEffect_*>::Count
                          ((ON_SimpleArray<const_ON_PostEffect_*> *)local_38);
        if (iVar2 <= (int)pep1) break;
        ppOVar5 = ON_SimpleArray<const_ON_PostEffect_*>::operator[]
                            ((ON_SimpleArray<const_ON_PostEffect_*> *)local_38,(int)pep1);
        pOVar1 = *ppOVar5;
        ppOVar5 = ON_SimpleArray<const_ON_PostEffect_*>::operator[]
                            ((ON_SimpleArray<const_ON_PostEffect_*> *)&i,(int)pep1);
        uVar4 = (*pOVar1->_vptr_ON_PostEffect[4])(pOVar1,*ppOVar5);
        if ((uVar4 & 1) != 0) {
          this_local._7_1_ = false;
          goto LAB_00810452;
        }
        pep1._0_4_ = (int)pep1 + 1;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
LAB_00810452:
    ON_SimpleArray<const_ON_PostEffect_*>::~ON_SimpleArray
              ((ON_SimpleArray<const_ON_PostEffect_*> *)&i);
    ON_SimpleArray<const_ON_PostEffect_*>::~ON_SimpleArray
              ((ON_SimpleArray<const_ON_PostEffect_*> *)local_38);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PostEffects::operator == (const ON_PostEffects& other) const
{
  // 3rd August 2023 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH3DM-158
  // The problem is that this is called during loading, but before the PEPs are loaded. This was
  // causing them to get populated too early so once they are loaded they don't actually get populated.

  // If the incoming pep list is not yet populated, they are equal if this one is also not populated
  // but not equal if this one is populated.
  if (!other._impl->_is_populated)
    return !_impl->_is_populated;

  // We don't want to populate this list if it's not yet populated. Remember, this method is const.
  if (!_impl->_is_populated)
    return false; // The incoming list is populated but this one isn't.

  // If we get here, the both lists are already populated, so we need to check if the lists are equal.
  ON_SimpleArray<const ON_PostEffect*> a1;
  GetPostEffects(a1);

  ON_SimpleArray<const ON_PostEffect*> a2;
  other.GetPostEffects(a2);

  if (a1.Count() != a2.Count())
    return false;

  for (int i = 0; i < a1.Count(); i++)
  {
    const ON_PostEffect& pep1 = *a1[i];
    const ON_PostEffect& pep2 = *a2[i];
    if (pep1 != pep2)
      return false;
  }

  return true;
}